

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O1

void ApplicativeHelper::getHeadAndArgs(Term *term,TermList *head,Deque<Kernel::TermList> *args)

{
  uint64_t uVar1;
  long lVar2;
  bool bVar3;
  
  if (*(long *)(args + 0x10) != *(long *)(args + 0x18)) {
    *(undefined8 *)(args + 0x10) = *(undefined8 *)(args + 8);
    *(undefined8 *)(args + 0x18) = *(undefined8 *)(args + 8);
  }
  bVar3 = Kernel::Term::isApplication(term);
  if (bVar3) {
    do {
      uVar1 = term->_args[(ulong)(*(uint *)&term->field_0xc & 0xfffffff) - 3]._content;
      if ((*(long *)(args + 0x18) == *(long *)(args + 0x10) + -8) ||
         ((*(long *)(args + 0x10) == *(long *)(args + 8) &&
          (*(long *)(args + 0x18) == *(long *)(args + 0x20) + -8)))) {
        ::Lib::Deque<Kernel::TermList>::expand(args);
      }
      if (*(long *)(args + 0x10) == *(long *)(args + 8)) {
        *(undefined8 *)(args + 0x10) = *(undefined8 *)(args + 0x20);
      }
      lVar2 = *(long *)(args + 0x10);
      *(long *)(args + 0x10) = lVar2 + -8;
      *(uint64_t *)(lVar2 + -8) = uVar1;
      term = (Term *)term->_args[(ulong)(*(uint *)&term->field_0xc & 0xfffffff) - 2]._content;
      head->_content = (uint64_t)term;
    } while ((((ulong)term & 3) == 0) && (bVar3 = Kernel::Term::isApplication(term), bVar3));
  }
  return;
}

Assistant:

void ApplicativeHelper::getHeadAndArgs(const Term* term, TermList& head, Deque<TermList>& args)
{
  ASS(term->isApplication());

  if(!args.isEmpty()){ args.reset(); }

  while(term->isApplication()){
    args.push_front(*term->nthArgument(3)); 
    head = *term->nthArgument(2);
    if(head.isTerm()){ 
      term = head.term();
    } else {  break; }
  }  
}